

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::find
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,C c,size_t index)

{
  ulong length;
  size_t sVar1;
  size_t sVar2;
  
  length = this->m_length;
  if (length < index || length - index == 0) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (index == 0) {
      sVar2 = StringDetailsBase<char>::find(this->m_p,length,c);
      return sVar2;
    }
    sVar1 = StringDetailsBase<char>::find(this->m_p + index,length - index,c);
    sVar2 = index + sVar1;
    if (sVar1 == 0xffffffffffffffff) {
      sVar2 = 0xffffffffffffffff;
    }
  }
  return sVar2;
}

Assistant:

size_t
	find(
		C c,
		size_t index = 0
	) const {
		if (index >= m_length)
			return -1;

		if (index == 0)
			return Details::find(m_p, m_length, c);

		size_t result = Details::find(m_p + index, m_length - index, c);
		return result != -1 ? result + index : -1;
	}